

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::force_tracker_request_url
          (torrent *this,time_point t,string *url,reannounce_flags_t flags)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  time_point32 now;
  announce_entry *e;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) != 0) {
    return;
  }
  e = tracker_list::find_tracker(&this->m_trackers,url);
  if (e != (announce_entry *)0x0) {
    bVar1 = anon_unknown_135::trigger_announce
                      ((this->super_torrent_hot_members).m_ses,
                       (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                       (bool)((byte)this->field_0x606 >> 6 & 1),flags,t,e);
    if (bVar1) {
      now = time_now32();
      update_tracker_timer(this,now);
      return;
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** found no tracker endpoints to announce");
    return;
  }
  UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
  (*UNRECOVERED_JUMPTABLE)
            (this,"*** tracker URL not found %s",(url->_M_dataplus)._M_p,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

bool torrent::is_paused() const
	{
		return m_paused || m_session_paused;
	}